

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_copy_propagation_elements.cpp
# Opt level: O2

ir_visitor_status __thiscall
anon_unknown.dwarf_8deca::ir_copy_propagation_elements_visitor::visit_leave
          (ir_copy_propagation_elements_visitor *this,ir_assignment *ir)

{
  ir_node_type iVar1;
  uint uVar2;
  ir_variable *piVar3;
  ir_dereference *piVar4;
  glsl_type *this_00;
  copy_propagation_state *pcVar5;
  ir_variable *piVar6;
  byte bVar7;
  bool bVar8;
  int i_1;
  int iVar9;
  undefined4 extraout_var;
  undefined1 (*pauVar10) [16];
  ir_variable *piVar11;
  acp_entry *paVar12;
  acp_entry *paVar13;
  int i_2;
  ir_rvalue *piVar14;
  long lVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  int __sig;
  uint uVar16;
  uint uVar17;
  ir_assignment *mem_ctx;
  long lVar18;
  uint uVar19;
  uint uVar20;
  int i;
  uint local_58 [4];
  uint auStack_48 [6];
  
  iVar1 = (ir->lhs->super_ir_rvalue).super_ir_instruction.ir_type;
  mem_ctx = ir;
  iVar9 = (*(ir->lhs->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[8])();
  if ((iVar1 == ir_type_dereference_variable) &&
     (bVar8 = glsl_type::is_vector(*(glsl_type **)(CONCAT44(extraout_var,iVar9) + 0x20)), bVar8)) {
    pauVar10 = (undefined1 (*) [16])
               (anonymous_namespace)::kill_entry::operator_new((size_t)this->lin_ctx,mem_ctx);
    uVar16 = (byte)ir->field_0x38 & 0xf;
    __sig = extraout_EDX;
  }
  else {
    uVar16 = 0xffffffff;
    pauVar10 = (undefined1 (*) [16])
               (anonymous_namespace)::kill_entry::operator_new((size_t)this->lin_ctx,mem_ctx);
    __sig = extraout_EDX_00;
  }
  *pauVar10 = (undefined1  [16])0x0;
  *(long *)pauVar10[1] = CONCAT44(extraout_var,iVar9);
  *(uint *)(pauVar10[1] + 8) = uVar16;
  kill(this,(__pid_t)pauVar10,__sig);
  if (ir->condition == (ir_rvalue *)0x0) {
    piVar11 = ir_assignment::whole_variable_written(ir);
    piVar14 = (ir_rvalue *)0x0;
    if ((ir->rhs->super_ir_instruction).ir_type == ir_type_dereference_variable) {
      piVar14 = ir->rhs;
    }
    if (((piVar11 == (ir_variable *)0x0) || (piVar14 == (ir_rvalue *)0x0)) ||
       (piVar3 = (ir_variable *)piVar14[1].super_ir_instruction._vptr_ir_instruction,
       piVar11 == piVar3 || piVar3 == (ir_variable *)0x0)) {
      piVar4 = ir->lhs;
      if (((piVar4 != (ir_dereference *)0x0) &&
          ((piVar4->super_ir_rvalue).super_ir_instruction.ir_type == ir_type_dereference_variable))
         && (((this_00 = (piVar4->super_ir_rvalue).type, this_00->vector_elements == '\x01' &&
              ((*(uint *)&this_00->field_0x4 & 0xfe) < 0xe)) ||
             (bVar8 = glsl_type::is_vector(this_00), bVar8)))) {
        piVar11 = (ir_variable *)piVar4[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction
        ;
        uVar16 = *(uint *)&piVar11->data;
        if ((uVar16 & 0xe000) != 0x2000) {
          piVar14 = ir->rhs;
          iVar1 = (piVar14->super_ir_instruction).ir_type;
          if ((piVar14 != (ir_rvalue *)0x0 && iVar1 == ir_type_dereference_variable) ||
             (((iVar1 == ir_type_swizzle && piVar14 != (ir_rvalue *)0x0 &&
               (piVar14 = (ir_rvalue *)piVar14[1].super_ir_instruction._vptr_ir_instruction,
               piVar14 != (ir_rvalue *)0x0)) &&
              ((piVar14->super_ir_instruction).ir_type == ir_type_dereference_variable)))) {
            piVar3 = (ir_variable *)piVar14[1].super_ir_instruction._vptr_ir_instruction;
            uVar2 = *(uint *)&piVar3->data;
            if ((uVar2 & 0xe000) != 0x2000) {
              uVar17 = (byte)ir->field_0x38 & 0xf;
              iVar9 = 0;
              for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
                if ((uVar17 >> ((uint)lVar15 & 0x1f) & 1) != 0) {
                  lVar18 = (long)iVar9;
                  iVar9 = iVar9 + 1;
                  auStack_48[lVar15] = auStack_48[lVar18 + -4];
                }
              }
              uVar19 = uVar17;
              if (piVar11 == piVar3) {
                for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
                  bVar7 = (byte)lVar15 & 0x1f;
                  uVar20 = -2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7;
                  if ((uVar17 >> (auStack_48[lVar15 + -4] & 0x1f) & 1) == 0) {
                    uVar20 = 0xffffffff;
                  }
                  uVar19 = uVar19 & uVar20;
                }
              }
              if (((uVar2 ^ uVar16) & 0x40) == 0) {
                pcVar5 = this->state;
                paVar12 = copy_propagation_state::pull_acp(pcVar5,piVar11);
                paVar12->rhs_full = (ir_variable *)0x0;
                for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
                  if ((uVar19 >> ((uint)lVar15 & 0x1f) & 1) != 0) {
                    piVar6 = paVar12->rhs_element[lVar15];
                    paVar12->rhs_element[lVar15] = piVar3;
                    paVar12->rhs_channel[lVar15] = auStack_48[lVar15];
                    copy_propagation_state::remove_unused_var_from_dsts
                              (pcVar5,paVar12,piVar11,piVar6);
                  }
                }
                paVar12 = copy_propagation_state::pull_acp(pcVar5,piVar3);
                _mesa_set_add(paVar12->dsts,piVar11);
              }
            }
          }
        }
      }
    }
    else if ((((*(uint *)&piVar11->data & 0xe000) != 0x2000) &&
             ((*(uint *)&piVar3->data & 0xe000) != 0x2000)) &&
            (((*(uint *)&piVar3->data ^ *(uint *)&piVar11->data) & 0x40) == 0)) {
      pcVar5 = this->state;
      paVar12 = copy_propagation_state::pull_acp(pcVar5,piVar11);
      piVar6 = paVar12->rhs_full;
      if (piVar6 != piVar3) {
        if (piVar6 == (ir_variable *)0x0) {
          bVar8 = glsl_type::is_vector(piVar11->type);
          if (bVar8) {
            for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
              if (paVar12->rhs_element[lVar15] != (ir_variable *)0x0) {
                copy_propagation_state::remove_from_dsts
                          (pcVar5,paVar12->rhs_element[lVar15],piVar11);
              }
            }
          }
        }
        else {
          copy_propagation_state::remove_from_dsts(pcVar5,piVar6,piVar11);
        }
        paVar12->rhs_full = piVar3;
        paVar13 = copy_propagation_state::pull_acp(pcVar5,piVar3);
        _mesa_set_add(paVar13->dsts,piVar11);
        bVar8 = glsl_type::is_vector(piVar11->type);
        if (bVar8) {
          for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
            paVar12->rhs_element[lVar15] = piVar3;
            paVar12->rhs_channel[lVar15] = (uint)lVar15;
          }
        }
      }
    }
  }
  return visit_continue;
}

Assistant:

ir_visitor_status
ir_copy_propagation_elements_visitor::visit_leave(ir_assignment *ir)
{
   ir_dereference_variable *lhs = ir->lhs->as_dereference_variable();
   ir_variable *var = ir->lhs->variable_referenced();

   kill_entry *k;

   if (lhs && var->type->is_vector())
      k = new(this->lin_ctx) kill_entry(var, ir->write_mask);
   else
      k = new(this->lin_ctx) kill_entry(var, ~0);

   kill(k);

   add_copy(ir);

   return visit_continue;
}